

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void freednsentry(void *freethis)

{
  *(undefined8 *)((long)freethis + 8) = 0;
  if (*(long *)((long)freethis + 0x10) != 0) {
    return;
  }
  Curl_freeaddrinfo(*freethis);
  (*Curl_cfree)(freethis);
  return;
}

Assistant:

static void freednsentry(void *freethis)
{
  struct Curl_dns_entry *p = (struct Curl_dns_entry *) freethis;

  /* mark the entry as not in hostcache */
  p->timestamp = 0;
  if(p->inuse == 0) {
    Curl_freeaddrinfo(p->addr);
    free(p);
  }
}